

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O2

void * dlwrap_real_dlsym(void *handle,char *name)

{
  void *pvVar1;
  long lVar2;
  
  if (dlwrap_real_dlsym::real_dlsym == (fips_dlsym_t)0x0) {
    lVar2 = 0;
    do {
      if (lVar2 == 0x28) {
        fwrite("Internal error: Failed to find real dlsym\n",0x2a,1,_stderr);
        fwrite("This may be a simple matter of fips not knowing about the version of GLIBC that\nyour program is using. Current known versions are:\n\n\t"
               ,0x85,1,_stderr);
        for (lVar2 = 0; lVar2 != 0x28; lVar2 = lVar2 + 8) {
          fprintf(_stderr,"%s ",*(undefined8 *)((long)&PTR_anon_var_dwarf_110f_00104d00 + lVar2));
        }
        fwrite("\n\nYou can inspect your version by first finding libdl.so.2:\n\n\tldd <your-program> | grep libdl.so\n\nAnd then inspecting the version attached to the dlsym symbol:\n\n\treadelf -s /path/to/libdl.so.2 | grep dlsym\n\nAnd finally, adding the version to dlwrap.c:dlwrap_real_dlsym.\n"
               ,0x10e,1,_stderr);
        exit(1);
      }
      dlwrap_real_dlsym::real_dlsym =
           (fips_dlsym_t)
           dlvsym(0xffffffffffffffff,"dlsym",
                  *(undefined8 *)((long)&PTR_anon_var_dwarf_110f_00104d00 + lVar2));
      lVar2 = lVar2 + 8;
    } while (dlwrap_real_dlsym::real_dlsym == (fips_dlsym_t)0x0);
  }
  pvVar1 = (*dlwrap_real_dlsym::real_dlsym)(handle,name);
  return pvVar1;
}

Assistant:

void *
dlwrap_real_dlsym(void *handle, const char *name)
{
    static fips_dlsym_t real_dlsym = NULL;

    if (!real_dlsym) {
        /* FIXME: This brute-force, hard-coded searching for a versioned
         * symbol is really ugly. The only reason I'm doing this is because
         * I need some way to lookup the "dlsym" function in libdl, but
         * I can't use 'dlsym' to do it. So dlvsym works, but forces me
         * to guess what the right version is.
         *
         * Potential fixes here:
         *
         *   1. Use libelf to actually inspect libdl.so and
         *      find the right version, (finding the right
         *      libdl.so can be made easier with
         *      dl_iterate_phdr).
         *
         *   2. Use libelf to find the offset of the 'dlsym'
         *      symbol within libdl.so, (and then add this to
         *      the base address at which libdl.so is loaded
         *      as reported by dl_iterate_phdr).
         *
         * In the meantime, I'll just keep augmenting this
         * hard-coded version list as people report bugs. */
        const char *version[] = {
            "GLIBC_2.4",
            "GLIBC_2.3",
            "GLIBC_2.2.5",
            "GLIBC_2.2",
            "GLIBC_2.0"
        };
        int num_versions = sizeof(version) / sizeof(version[0]);
        int i;
        for (i = 0; i < num_versions; i++) {
            real_dlsym = (fips_dlsym_t) dlvsym(RTLD_NEXT, "dlsym", version[i]);
            if (real_dlsym)
                break;
        }
        if (i == num_versions) {
            fprintf(stderr, "Internal error: Failed to find real dlsym\n");
            fprintf(stderr,
                    "This may be a simple matter of fips not knowing about the version of GLIBC that\n"
                    "your program is using. Current known versions are:\n\n\t");
            for (i = 0; i < num_versions; i++)
                fprintf(stderr, "%s ", version[i]);
            fprintf(stderr,
                    "\n\nYou can inspect your version by first finding libdl.so.2:\n"
                    "\n"
                    "\tldd <your-program> | grep libdl.so\n"
                    "\n"
                    "And then inspecting the version attached to the dlsym symbol:\n"
                    "\n"
                    "\treadelf -s /path/to/libdl.so.2 | grep dlsym\n"
                    "\n"
                    "And finally, adding the version to dlwrap.c:dlwrap_real_dlsym.\n");

            exit(1);
        }
    }

    return real_dlsym(handle, name);
}